

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::DefineOwnPropertyForTypedArray
               (TypedArrayBase *typedArray,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  double local_60;
  double result;
  PropertyString *propertyString;
  Var value;
  uint32 length;
  uint32 uint32Index;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *pPStack_28;
  bool throwOnError_local;
  PropertyDescriptor *descriptor_local;
  TypedArrayBase *pTStack_18;
  PropertyId propId_local;
  TypedArrayBase *typedArray_local;
  
  propertyRecord = (PropertyRecord *)scriptContext;
  scriptContext_local._7_1_ = throwOnError;
  pPStack_28 = descriptor;
  descriptor_local._4_4_ = propId;
  pTStack_18 = typedArray;
  _length = ScriptContext::GetPropertyName(scriptContext,propId);
  bVar1 = PropertyRecord::IsNumeric(_length);
  if (bVar1) {
    value._4_4_ = PropertyRecord::GetNumericValue(_length);
    value._0_4_ = ArrayObject::GetLength((ArrayObject *)pTStack_18);
    if (value._4_4_ < (uint32)value) {
      bVar1 = PropertyDescriptor::IsAccessorDescriptor(pPStack_28);
      if ((((bVar1) ||
           ((bVar1 = PropertyDescriptor::ConfigurableSpecified(pPStack_28), bVar1 &&
            (bVar1 = PropertyDescriptor::IsConfigurable(pPStack_28), bVar1)))) ||
          ((bVar1 = PropertyDescriptor::EnumerableSpecified(pPStack_28), bVar1 &&
           (bVar1 = PropertyDescriptor::IsEnumerable(pPStack_28), !bVar1)))) ||
         ((bVar1 = PropertyDescriptor::WritableSpecified(pPStack_28), bVar1 &&
          (bVar1 = PropertyDescriptor::IsWritable(pPStack_28), !bVar1)))) {
        typedArray_local._4_4_ =
             Reject((bool)(scriptContext_local._7_1_ & 1),(ScriptContext *)propertyRecord,
                    -0x7ff5ec2a,descriptor_local._4_4_);
      }
      else {
        bVar1 = PropertyDescriptor::ValueSpecified(pPStack_28);
        if (bVar1) {
          propertyString = (PropertyString *)PropertyDescriptor::GetValue(pPStack_28);
          typedArray_local._4_4_ =
               (*(pTStack_18->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                 super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[0x70])(pTStack_18,(ulong)value._4_4_,propertyString);
        }
        else {
          typedArray_local._4_4_ = 1;
        }
      }
    }
    else {
      typedArray_local._4_4_ =
           Reject((bool)(scriptContext_local._7_1_ & 1),(ScriptContext *)propertyRecord,-0x7ff5e9e1,
                  descriptor_local._4_4_);
    }
  }
  else {
    bVar1 = PropertyRecord::IsSymbol(_length);
    if (!bVar1) {
      result = (double)ScriptContext::GetPropertyString
                                 ((ScriptContext *)propertyRecord,descriptor_local._4_4_);
      BVar2 = JavascriptConversion::CanonicalNumericIndexString
                        ((JavascriptString *)result,&local_60,(ScriptContext *)propertyRecord);
      if (BVar2 != 0) {
        BVar2 = Reject((bool)(scriptContext_local._7_1_ & 1),(ScriptContext *)propertyRecord,
                       -0x7ff5e9e1,descriptor_local._4_4_);
        return BVar2;
      }
    }
    typedArray_local._4_4_ =
         DefineOwnPropertyDescriptor
                   ((RecyclableObject *)pTStack_18,descriptor_local._4_4_,pPStack_28,
                    (bool)(scriptContext_local._7_1_ & 1),(ScriptContext *)propertyRecord,
                    PropertyOperation_None);
  }
  return typedArray_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::DefineOwnPropertyForTypedArray(TypedArrayBase* typedArray, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* scriptContext)
    {
        // 1. Assert: IsPropertyKey(P) is true.
        // 2. Assert: Assert: O is an Object that has a [[ViewedArrayBuffer]] internal slot.

        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propId);
        // 3. If Type(P) is String, then
        // a. Let numericIndex be ! CanonicalNumericIndexString(P).
        // b. If numericIndex is not undefined, then
        // i. if IsInteger(numbericIndex), return false
        // ii. if numbericIndex = -0, return false
        // iii. If numericIndex < 0, return false.

        if (propertyRecord->IsNumeric()) {
            uint32 uint32Index = propertyRecord->GetNumericValue();
            // iv. Let length be O.[[ArrayLength]].
            uint32 length = typedArray->GetLength();
            // v. If numericIndex >= length, return false.
            if (uint32Index >= length)
            {
                return Reject(throwOnError, scriptContext, JSERR_InvalidTypedArrayIndex, propId);
            }
            // vi. If IsAccessorDescriptor(Desc) is true, return false.
            // vii. If Desc has a[[Configurable]] field and if Desc.[[Configurable]] is true, return false.
            // viii. If Desc has an[[Enumerable]] field and if Desc.[[Enumerable]] is false, return false.
            // ix. If Desc has a[[Writable]] field and if Desc.[[Writable]] is false, return false.
            if (descriptor.IsAccessorDescriptor()
                || (descriptor.ConfigurableSpecified() && descriptor.IsConfigurable())
                || (descriptor.EnumerableSpecified() && !descriptor.IsEnumerable())
                || (descriptor.WritableSpecified() && !descriptor.IsWritable()))
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_NotConfigurable, propId);
            }            // x. If Desc has a[[Value]] field, then
            // 1. Let value be Desc.[[Value]].
            // 2. Return ? IntegerIndexedElementSet(O, numericIndex, value).
            if (descriptor.ValueSpecified())
            {
                Js::Var value = descriptor.GetValue();
                return typedArray->DirectSetItem(uint32Index, value);
            }
            // xi. Return true.
            return true;
        }
        if (!propertyRecord->IsSymbol())
        {
            PropertyString *propertyString = scriptContext->GetPropertyString(propId);
            double result;
            if (JavascriptConversion::CanonicalNumericIndexString(propertyString, &result, scriptContext))
            {
                return Reject(throwOnError, scriptContext, JSERR_InvalidTypedArrayIndex, propId);
            }
        }
        // 4. Return ! OrdinaryDefineOwnProperty(O, P, Desc).
        return DefineOwnPropertyDescriptor(typedArray, propId, descriptor, throwOnError, scriptContext);
    }